

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda_rpa.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  bool bVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  double t145;
  double t143;
  double t140;
  double t139;
  double t138;
  double t135;
  double t133;
  double t132;
  double t128;
  double t127;
  double t126;
  double t110;
  double t103;
  double t102;
  double t98;
  double t97;
  double t96;
  double t80;
  double t74;
  double t73;
  double t69;
  double t68;
  double t66;
  double t65;
  double t64;
  double t63;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t56;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t46;
  double t45;
  double t44;
  double t40;
  double t39;
  double t38;
  double t35;
  double t31;
  double t23;
  double t22;
  double t16;
  double t13;
  double t12;
  double t11;
  double t10;
  double t134;
  double t125;
  double t120;
  double t117;
  double t113;
  double t112;
  double t107;
  double t106;
  double t105;
  double t95;
  double t90;
  double t87;
  double t83;
  double t82;
  double t77;
  double t76;
  double t75;
  double t37;
  double t30;
  double t27;
  double t20;
  double t19;
  double t18;
  double t9;
  double t8;
  double t4;
  double t2;
  double t1;
  double t70;
  double t7;
  double t6;
  double t3;
  double e;
  double in_stack_fffffffffffffd00;
  double x;
  
  dVar2 = in_XMM0_Qa + in_XMM1_Qa;
  dVar3 = safe_math::cbrt<double>(9.82362581201651e-318);
  dVar3 = (1.0 / dVar3) * 1.720508027656199;
  e = 0.25;
  safe_math::sqrt<double>(9.82448054558381e-318);
  pow_3_2<double>(in_stack_fffffffffffffd00);
  safe_math::pow<double,double>(in_stack_fffffffffffffd00,e);
  dVar4 = safe_math::log<double>(9.82592321726967e-318);
  dVar4 = (dVar3 * 0.11895241781024411 * 0.25 + 1.0) * 0.031091 * dVar4;
  dVar5 = in_XMM0_Qa - in_XMM1_Qa;
  dVar6 = dVar5 * (1.0 / dVar2);
  dVar7 = dVar6 + 1.0;
  x = 1e-15;
  dVar8 = safe_math::cbrt<double>(9.8278204293497e-318);
  dVar8 = dVar8 * x;
  dVar9 = safe_math::cbrt<double>(9.82807240282908e-318);
  dVar7 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar7 <= 1e-15) & 0x3ff0000000000000) != 0.0) & 1),
                     dVar8,dVar9 * dVar7);
  dVar6 = 1.0 - dVar6;
  bVar1 = dVar6 <= x;
  dVar9 = safe_math::cbrt<double>(9.82888267048826e-318);
  dVar8 = piecewise_functor_3<double>
                    ((double)(-(ulong)bVar1 & 0x3ff0000000000000) != 0.0,dVar8,dVar9 * dVar6);
  dVar7 = ((dVar7 + dVar8) - 2.0) * 1.9236610509315362;
  safe_math::pow<double,double>(x,e);
  dVar8 = safe_math::log<double>(9.83104667801704e-318);
  dVar9 = (dVar3 * 0.04157861286239228) / 4.0 + 1.0;
  safe_math::pow<double,double>(x,e);
  dVar6 = safe_math::log<double>(9.83236583329144e-318);
  *in_RDI = -(dVar4 + dVar4) +
            dVar5 * dVar5 * dVar5 * dVar5 * (1.0 / (dVar2 * dVar2 * dVar2 * dVar2)) *
            dVar7 * (dVar4 + dVar4 +
                    ((dVar3 * 0.051018136300054265) / 4.0 + 1.0) * -0.03109 * dVar8 +
                    -(dVar9 * 0.033774 * dVar6 * 0.5848223397455204)) +
            dVar7 * 2.0 * 0.016887 * dVar9 * dVar6 * 0.5848223397455204;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t70 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t18 = 0.1e1 / t1;
    constexpr double t19 = beta1_0;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = beta2_0 * t3;
    constexpr double t30 = beta3_0;
    constexpr double t37 = pp_0 + 0.1e1;
    constexpr double t75 = a_1;
    constexpr double t76 = alpha1_1;
    constexpr double t77 = t76 * t3;
    constexpr double t82 = 0.1e1 / t75;
    constexpr double t83 = beta1_1;
    constexpr double t87 = beta2_1 * t3;
    constexpr double t90 = beta3_1;
    constexpr double t95 = pp_1 + 0.1e1;
    constexpr double t105 = a_2;
    constexpr double t106 = alpha1_2;
    constexpr double t107 = t106 * t3;
    constexpr double t112 = 0.1e1 / t105;
    constexpr double t113 = beta1_2;
    constexpr double t117 = beta2_2 * t3;
    constexpr double t120 = beta3_2;
    constexpr double t125 = pp_2 + 0.1e1;
    constexpr double t134 = 0.1e1 / fz20;


    const double t10 = rho_a + rho_b;
    const double t11 = safe_math::cbrt( t10 );
    const double t12 = 0.1e1 / t11;
    const double t13 = t9 * t12;
    const double t16 = 0.1e1 + t4 * t13 / 0.4e1;
    const double t22 = t20 * t8 * t12;
    const double t23 = safe_math::sqrt( t22 );
    const double t31 = pow_3_2( t22 );
    const double t35 = t22 / 0.4e1;
    const double t38 = safe_math::pow( t35, t37 );
    const double t39 = beta4_0 * t38;
    const double t40 = t19 * t23 / 0.2e1 + t27 * t13 / 0.4e1 + 0.125e0 * t30 * t31 + t39;
    const double t44 = 0.1e1 + t18 / t40 / 0.2e1;
    const double t45 = safe_math::log( t44 );
    const double t46 = t1 * t16 * t45;
    const double t47 = 0.2e1 * t46;
    const double t48 = rho_a - rho_b;
    const double t49 = t48 * t48;
    const double t50 = t49 * t49;
    const double t51 = t10 * t10;
    const double t52 = t51 * t51;
    const double t53 = 0.1e1 / t52;
    const double t54 = t50 * t53;
    const double t55 = 0.1e1 / t10;
    const double t56 = t48 * t55;
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( zeta_tol );
    const double t60 = t59 * zeta_tol;
    const double t61 = safe_math::cbrt( t57 );
    const double t63 = piecewise_functor_3( t58, t60, t61 * t57 );
    const double t64 = 0.1e1 - t56;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t60, t66 * t64 );
    const double t69 = t63 + t68 - 0.2e1;
    const double t73 = 0.1e1 / ( 0.2e1 * t70 - 0.2e1 );
    const double t74 = t69 * t73;
    const double t80 = 0.1e1 + t77 * t13 / 0.4e1;
    const double t96 = safe_math::pow( t35, t95 );
    const double t97 = beta4_1 * t96;
    const double t98 = t83 * t23 / 0.2e1 + t87 * t13 / 0.4e1 + 0.125e0 * t90 * t31 + t97;
    const double t102 = 0.1e1 + t82 / t98 / 0.2e1;
    const double t103 = safe_math::log( t102 );
    const double t110 = 0.1e1 + t107 * t13 / 0.4e1;
    const double t126 = safe_math::pow( t35, t125 );
    const double t127 = beta4_2 * t126;
    const double t128 = t113 * t23 / 0.2e1 + t117 * t13 / 0.4e1 + 0.125e0 * t120 * t31 + t127;
    const double t132 = 0.1e1 + t112 / t128 / 0.2e1;
    const double t133 = safe_math::log( t132 );
    const double t135 = t133 * t134;
    const double t138 = -0.2e1 * t75 * t80 * t103 - 0.2e1 * t105 * t110 * t135 + 0.2e1 * t46;
    const double t139 = t74 * t138;
    const double t140 = t54 * t139;
    const double t143 = t110 * t133 * t134;
    const double t145 = 0.2e1 * t74 * t105 * t143;


    eps = -t47 + t140 + t145;

  }